

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::FileGenerator::Validate(FileGenerator *this,string *error)

{
  bool bVar1;
  
  bVar1 = ClassNameResolver::HasConflictingClassName
                    (this->name_resolver_,this->file_,&this->classname_);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)error);
    std::__cxx11::string::append((char *)error);
    std::__cxx11::string::append((string *)error);
    std::__cxx11::string::append((char *)error);
  }
  return !bVar1;
}

Assistant:

bool FileGenerator::Validate(string* error) {
  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.
  if (name_resolver_->HasConflictingClassName(file_, classname_)) {
    error->assign(file_->name());
    error->append(
      ": Cannot generate Java output because the file's outer class name, \"");
    error->append(classname_);
    error->append(
      "\", matches the name of one of the types declared inside it.  "
      "Please either rename the type or use the java_outer_classname "
      "option to specify a different outer class name for the .proto file.");
    return false;
  }
  return true;
}